

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp __thiscall rapidjson::internal::DiyFp::operator*(DiyFp *this,DiyFp *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  DiyFp DVar7;
  uint64_t tmp;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t M32;
  DiyFp *rhs_local;
  DiyFp *this_local;
  undefined4 local_10;
  
  uVar1 = (ulong)*(uint *)((long)&this->f + 4);
  uVar2 = (ulong)(uint)this->f;
  uVar3 = (ulong)*(uint *)((long)&rhs->f + 4);
  uVar4 = (ulong)(uint)rhs->f;
  uVar5 = uVar2 * uVar3;
  uVar6 = uVar1 * uVar4;
  DiyFp((DiyFp *)&this_local,
        uVar1 * uVar3 + (uVar6 >> 0x20) + (uVar5 >> 0x20) +
        ((uVar2 * uVar4 >> 0x20) + (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff) + 0x80000000 >> 0x20)
        ,this->e + 0x40 + rhs->e);
  DVar7._12_4_ = 0;
  DVar7.f = (uint64_t)this_local;
  DVar7.e = local_10;
  return DVar7;
}

Assistant:

DiyFp operator*(const DiyFp& rhs) const {
#if defined(_MSC_VER) && defined(_M_AMD64)
        uint64_t h;
        uint64_t l = _umul128(f, rhs.f, &h);
        if (l & (uint64_t(1) << 63)) // rounding
            h++;
        return DiyFp(h, e + rhs.e + 64);
#elif (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 6)) && defined(__x86_64__)
        __extension__ typedef unsigned __int128 uint128;
        uint128 p = static_cast<uint128>(f) * static_cast<uint128>(rhs.f);
        uint64_t h = static_cast<uint64_t>(p >> 64);
        uint64_t l = static_cast<uint64_t>(p);
        if (l & (uint64_t(1) << 63)) // rounding
            h++;
        return DiyFp(h, e + rhs.e + 64);
#else
        const uint64_t M32 = 0xFFFFFFFF;
        const uint64_t a = f >> 32;
        const uint64_t b = f & M32;
        const uint64_t c = rhs.f >> 32;
        const uint64_t d = rhs.f & M32;
        const uint64_t ac = a * c;
        const uint64_t bc = b * c;
        const uint64_t ad = a * d;
        const uint64_t bd = b * d;
        uint64_t tmp = (bd >> 32) + (ad & M32) + (bc & M32);
        tmp += 1U << 31;  /// mult_round
        return DiyFp(ac + (ad >> 32) + (bc >> 32) + (tmp >> 32), e + rhs.e + 64);
#endif
    }